

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall
HModel::util_chgCostsSet(HModel *this,int ncols,int *XcolCostIndex,double *XcolCostValues)

{
  int iVar1;
  reference pvVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int col;
  int ix;
  int in_stack_ffffffffffffffbc;
  HModel *in_stack_ffffffffffffffc0;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    iVar1 = *(int *)(in_RDX + (long)local_24 * 4);
    in_stack_ffffffffffffffc0 = *(HModel **)(in_RCX + (long)local_24 * 8);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),(long)iVar1);
    dVar3 = (double)in_stack_ffffffffffffffc0 * *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)iVar1);
    *pvVar2 = dVar3;
  }
  mlFg_Update(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  return 0;
}

Assistant:

int HModel::util_chgCostsSet(int ncols, const int* XcolCostIndex, const double* XcolCostValues) {
  assert(XcolCostIndex != NULL);
  assert(XcolCostValues != NULL);
  for (int ix = 0; ix < ncols; ++ix) {
    int col = XcolCostIndex[ix];
    assert(0 <= col);
    assert(col < numCol);
    colCost[col] =  XcolCostValues[ix] * colScale[col];
  }
  //Deduce the consequences of new costs
  mlFg_Update(mlFg_action_NewCosts);
  return 0;
}